

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall DROPlayer::Seek(DROPlayer *this,UINT8 unit,UINT32 pos)

{
  uint local_20;
  UINT32 pos_local;
  UINT8 unit_local;
  DROPlayer *this_local;
  
  local_20 = pos;
  switch(unit) {
  case '\0':
    this->_playState = this->_playState | 8;
    if (pos < this->_filePos) {
      (*(this->super_PlayerBase)._vptr_PlayerBase[0x21])();
    }
    this_local._7_1_ = SeekToFilePos(this,pos);
    break;
  case '\x02':
    local_20 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x16])(this,(ulong)pos);
  case '\x01':
    this->_playState = this->_playState | 8;
    if (local_20 < this->_playTick) {
      (*(this->super_PlayerBase)._vptr_PlayerBase[0x21])();
    }
    this_local._7_1_ = SeekToTick(this,local_20);
    break;
  case '\x03':
  default:
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 DROPlayer::Seek(UINT8 unit, UINT32 pos)
{
	switch(unit)
	{
	case PLAYPOS_FILEOFS:
		_playState |= PLAYSTATE_SEEK;
		if (pos < _filePos)
			Reset();
		return SeekToFilePos(pos);
	case PLAYPOS_SAMPLE:
		pos = Sample2Tick(pos);
		// fall through
	case PLAYPOS_TICK:
		_playState |= PLAYSTATE_SEEK;
		if (pos < _playTick)
			Reset();
		return SeekToTick(pos);
	case PLAYPOS_COMMAND:
	default:
		return 0xFF;
	}
}